

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::net::http::Method_testParse_Test::~Method_testParse_Test(Method_testParse_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Method, testParse)
{
    ASSERT_EQ(Method::OPTIONS, parseMethod("OPTIONS"));
    ASSERT_EQ(Method::GET, parseMethod("GET"));
    ASSERT_EQ(Method::HEAD, parseMethod("HEAD"));
    ASSERT_EQ(Method::POST, parseMethod("POST"));
    ASSERT_EQ(Method::PUT, parseMethod("PUT"));
    ASSERT_EQ(Method::DELETE, parseMethod("DELETE"));
    ASSERT_EQ(Method::TRACE, parseMethod("TRACE"));
    ASSERT_EQ(Method::CONNECT, parseMethod("CONNECT"));
    ASSERT_EQ(Method::EXTENSION, parseMethod("post"));
}